

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>::CreateBCGeoEl
          (TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *this,int side,int bc
          )

{
  bool bVar1;
  bool bVar2;
  MElementType MVar3;
  MElementType MVar4;
  int iVar5;
  ostream *poVar6;
  int *piVar7;
  int64_t iVar8;
  TPZGeoMesh *gel;
  undefined4 extraout_var;
  uint in_EDX;
  int in_ESI;
  TPZGeoEl *in_RDI;
  TPZGeoElSide thisside;
  TPZGeoElSide BCGelside;
  TPZGeoEl *BCGeoEl;
  MElementType BCtype;
  int64_t index;
  int orientednode;
  int inode;
  TPZManVector<long,_4> nodeindices;
  TPZGeoEl *BCGeoEl_1;
  int lside;
  int lowside;
  bool straight;
  TPZStack<int,_10> LowAllSides;
  int i;
  TPZManVector<int,_27> mapside;
  int sizeMap;
  int sidennodes;
  MElementType sidetype;
  int sideorient;
  int faceSide;
  int nsides;
  int in_stack_fffffffffffffd1c;
  TPZManVector<int,_27> *in_stack_fffffffffffffd20;
  TPZStack<int,_10> *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  TPZGeoEl *in_stack_fffffffffffffd38;
  TPZManVector<long,_4> *in_stack_fffffffffffffd40;
  initializer_list<int> *in_stack_fffffffffffffd48;
  TPZManVector<int,_27> *in_stack_fffffffffffffd50;
  undefined1 local_220 [8];
  int local_218;
  int local_214;
  TPZVec<long> local_210;
  TPZVec<int> *in_stack_fffffffffffffe20;
  TPZGeoElSide *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int local_1b8;
  TPZVec<int> local_1b0 [2];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_148;
  undefined8 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined4 uStack_120;
  undefined4 local_11c;
  undefined4 uStack_118;
  undefined8 uStack_114;
  undefined8 *local_108;
  undefined8 local_100;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 *local_e8;
  undefined8 local_e0;
  int local_c8;
  undefined4 local_c4;
  TPZVec<int> local_c0 [4];
  int local_30;
  int local_2c;
  MElementType local_28;
  int local_24;
  int local_20 [3];
  int local_14;
  TPZManVector<int,_27> *local_8;
  TPZManVector<int,_27> *pTVar9;
  
  local_20[1] = 7;
  local_14 = in_ESI;
  if ((in_ESI < 0) || (6 < in_ESI)) {
    poVar6 = std::operator<<((ostream *)&std::cout,"\n (");
    MVar3 = pztopology::TPZTriangle::Type();
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,MVar3);
    poVar6 = std::operator<<(poVar6,")::CreateBCGeoEl unexpected side = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_14);
    std::operator<<(poVar6,"\n");
    local_8 = (TPZManVector<int,_27> *)0x0;
  }
  else {
    local_20[0] = in_ESI + -3;
    local_24 = 1;
    local_20[2] = in_EDX;
    local_24 = pztopology::TPZTriangle::GetSideOrient(local_20);
    local_28 = pztopology::TPZTriangle::Type(local_14);
    local_2c = pztopology::TPZTriangle::NSideNodes(local_14);
    local_30 = 0;
    switch(local_28) {
    case EPoint:
      local_30 = 1;
      break;
    case EOned:
      local_30 = 3;
      break;
    case ETriangle:
      local_30 = 7;
      break;
    case EQuadrilateral:
      local_30 = 9;
      break;
    default:
      pzinternal::DebugStopImpl
                ((char *)LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore,
                 (size_t)LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec);
    }
    local_c4 = 0;
    TPZManVector<int,_27>::TPZManVector
              (in_stack_fffffffffffffd50,(int64_t)in_stack_fffffffffffffd48,
               (int *)in_stack_fffffffffffffd40);
    for (local_c8 = 0; iVar5 = local_c8, local_c8 < local_30; local_c8 = local_c8 + 1) {
      piVar7 = TPZVec<int>::operator[](local_c0,(long)local_c8);
      *piVar7 = iVar5;
    }
    if (local_24 == -1) {
      if (local_28 == EOned) {
        local_f4 = 1;
        local_f0 = 0;
        local_ec = 2;
        local_e8 = &local_f4;
        local_e0 = 3;
        TPZManVector<int,_27>::operator=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      }
      else if (local_28 == ETriangle) {
        uStack_118 = 4;
        uStack_114 = 0x600000003;
        local_128 = 0x200000000;
        uStack_120 = 1;
        local_11c = 5;
        local_108 = &local_128;
        local_100 = 7;
        TPZManVector<int,_27>::operator=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      }
      else if (local_28 == EQuadrilateral) {
        local_158 = 0x600000007;
        uStack_150 = 0x400000005;
        local_168 = 0x300000000;
        uStack_160 = 0x100000002;
        local_148 = 8;
        local_138 = &local_168;
        local_130 = 9;
        TPZManVector<int,_27>::operator=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      }
    }
    TPZStack<int,_10>::TPZStack
              ((TPZStack<int,_10> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    pztopology::TPZTriangle::LowerDimensionSides
              (in_stack_fffffffffffffd34,in_stack_fffffffffffffd28);
    TPZStack<int,_10>::Push
              ((TPZStack<int,_10> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
    bVar1 = pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>::IsLinearMapping(local_14);
    for (local_1b8 = 0; iVar8 = TPZVec<int>::NElements(local_1b0), local_1b8 < iVar8;
        local_1b8 = local_1b8 + 1) {
      piVar7 = TPZVec<int>::operator[](local_1b0,(long)local_1b8);
      if (2 < *piVar7) {
        bVar2 = pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>::IsLinearMapping(*piVar7);
        if (!bVar2) {
          bVar1 = false;
        }
        if (!bVar1) break;
      }
    }
    if (bVar1) {
      TPZManVector<long,_4>::TPZManVector
                (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38);
      for (local_214 = 0; local_214 < local_2c; local_214 = local_214 + 1) {
        local_218 = local_214;
        if (local_24 == -1) {
          piVar7 = TPZVec<int>::operator[](local_c0,(long)local_214);
          local_218 = *piVar7;
        }
        in_stack_fffffffffffffd40 =
             (TPZManVector<long,_4> *)
             (**(code **)(*(long *)in_RDI + 0x128))(in_RDI,local_14,local_214);
        in_stack_fffffffffffffd38 = (TPZGeoEl *)TPZVec<long>::operator[](&local_210,(long)local_218)
        ;
        *(TPZManVector<long,_4> **)in_stack_fffffffffffffd38 = in_stack_fffffffffffffd40;
      }
      MVar4 = pztopology::TPZTriangle::Type(local_14);
      MVar3 = MVar4;
      gel = TPZGeoEl::Mesh(in_RDI);
      iVar5 = (*(gel->super_TPZSavable)._vptr_TPZSavable[0xc])
                        (gel,(ulong)MVar4,&local_210,(ulong)(uint)local_20[2],local_220,1);
      pTVar9 = (TPZManVector<int,_27> *)CONCAT44(extraout_var,iVar5);
      in_stack_fffffffffffffd20 = pTVar9;
      TPZGeoElSide::TPZGeoElSide
                ((TPZGeoElSide *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      TPZGeoElSide::TPZGeoElSide
                ((TPZGeoElSide *)CONCAT44(MVar3,in_stack_fffffffffffffd30),(TPZGeoEl *)gel,
                 (int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
      TPZGeoElSide::InsertConnectivity
                ((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      (*(pTVar9->super_TPZVec<int>)._vptr_TPZVec[0xf])();
      local_8 = pTVar9;
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x17d58f4);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x17d5901);
      TPZManVector<long,_4>::~TPZManVector((TPZManVector<long,_4> *)in_stack_fffffffffffffd20);
    }
    else {
      local_8 = (TPZManVector<int,_27> *)
                (**(code **)(*(long *)in_RDI + 0x2e0))(in_RDI,local_14,local_20[2],local_c0);
    }
    TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x17d5970);
    TPZManVector<int,_27>::~TPZManVector(in_stack_fffffffffffffd20);
  }
  return (TPZGeoEl *)local_8;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::CreateBCGeoEl(int side, int bc){
	// Consistency check
	int nsides = TGeo::NSides;
	if(side<0 || side >= nsides){
		std::cout << "\n ("<<TGeo::Type()<<")::CreateBCGeoEl unexpected side = " << side << "\n";
		return 0;
	}
	if(fGeo.Dimension == 3 && side == nsides-1){
		std::cout <<"\nCreateBCGeoEl not implemented for tridimensional sides \n";
		return 0;
	}
    
    // the side orientation will be +1 if the side is oriented counterclockwise
    // -1 if the side is clockwise
    
    
    int faceSide = 0;
    if (fGeo.Dimension == 2){
        faceSide = side - TGeo::NCornerNodes;
    } else if (fGeo.Dimension == 3){
        faceSide = side - TGeo::NCornerNodes - TGeo::NumSides(1);
    }

    int sideorient = 1;
    switch (TGeo::Type())
    {
    case ETriangle:
        sideorient = pztopology::TPZTriangle::GetSideOrient(faceSide);
        break;
    case EQuadrilateral:
        sideorient = pztopology::TPZQuadrilateral::GetSideOrient(faceSide);
        break;
    case ETetraedro:
        sideorient = pztopology::TPZTetrahedron::GetSideOrient(faceSide);
        break;
    case ECube:
        sideorient = pztopology::TPZCube::GetSideOrient(faceSide);
        break;
    case EPrisma:
        sideorient = pztopology::TPZPrism::GetSideOrient(faceSide);
        break;
    
    default:
        break;
    }
    
    
    // Build vector with node indices of element to be created
    MElementType sidetype = TGeo::Type(side);
    int sidennodes = TGeo::NSideNodes(side);
    int sizeMap = 0;
    switch (sidetype){
    case EPoint:
        sizeMap = 1;
        break;
    case EOned:
        sizeMap = 3;
        break;
    case ETriangle:
        sizeMap = 7;
        break;
    case EQuadrilateral:
        sizeMap = 9;
        break;
    default:
        DebugStop();
    }

    TPZManVector<int,27> mapside(sizeMap,0);
    for(int i=0; i<sizeMap; i++) mapside[i] = i;
    
    if(sideorient == -1)
    {
        switch(sidetype){
            case EOned:
                mapside = {1,0,2};
                break;
            case ETriangle:
                mapside = {0,2,1,5,4,3,6};
                break;
            case EQuadrilateral:
                mapside = {0,3,2,1,7,6,5,4,8};
            default:
                break;
        }
    }

	// Is side straight?
	TPZStack<int> LowAllSides;
	TGeo::LowerDimensionSides(side,LowAllSides);
    LowAllSides.Push(side);
	bool straight = true;
    if(fGeo.IsLinearMapping(side) == false) straight = false;
	for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
	{
		int lside = LowAllSides[lowside]; 
		if(lside < TGeo::NNodes) continue;
		if(fGeo.IsLinearMapping(lside) == false) straight = false;
		if(straight == false) break;
	}
	if(straight == false)
	{
		TPZGeoEl *BCGeoEl = CreateBCGeoBlendEl(side,bc,mapside);
		return BCGeoEl;
	}
	
	// else

	TPZManVector<int64_t,4> nodeindices(sidennodes);
	for(int inode = 0; inode < sidennodes; inode++){
        int orientednode = inode;
        if(sideorient == -1) orientednode = mapside[inode];
		nodeindices[orientednode] = this->SideNodeIndex(side,inode);
	}

	// Create GeoElement
	int64_t index;
	MElementType BCtype = TGeo::Type(side);
	TPZGeoEl *BCGeoEl = this->Mesh()->CreateGeoElement(BCtype, nodeindices, bc, index);

    TPZGeoElSide BCGelside(BCGeoEl);
    TPZGeoElSide thisside(this,side);
    BCGelside.InsertConnectivity(thisside,mapside);
    /*
	// Set Connectivity
	int sidensides = TGeo::NContainedSides(side);
	for(int iside=0; iside < sidensides-1; iside++){
		TPZGeoElSide(BCGeoEl,mapside[iside]).SetConnectivity(TPZGeoElSide(this,TGeo::ContainedSideLocId(side,iside)));
	}
	TPZGeoElSide(BCGeoEl, sidensides-1).SetConnectivity(TPZGeoElSide(this,side));
*/
	// Return pointer to new element
	BCGeoEl->Initialize();
	return BCGeoEl;  
}